

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

nh_bool apply_override_list(curses_symdef *list,wchar_t len,curses_symdef *ovr,nh_bool cust)

{
  int iVar1;
  wchar_t local_30;
  wchar_t i;
  nh_bool cust_local;
  curses_symdef *ovr_local;
  wchar_t len_local;
  curses_symdef *list_local;
  
  local_30 = L'\0';
  while( true ) {
    if (len <= local_30) {
      return '\0';
    }
    iVar1 = strcmp(list[local_30].symname,ovr->symname);
    if (iVar1 == 0) break;
    local_30 = local_30 + L'\x01';
  }
  if (ovr->unichar[0] != L'\0') {
    *(undefined8 *)list[local_30].unichar = *(undefined8 *)ovr->unichar;
    *(undefined8 *)(list[local_30].unichar + 2) = *(undefined8 *)(ovr->unichar + 2);
    list[local_30].unichar[4] = ovr->unichar[4];
  }
  if (ovr->ch != 0) {
    list[local_30].ch = ovr->ch;
  }
  if (ovr->color != -1) {
    list[local_30].color = ovr->color;
  }
  list[local_30].custom = cust;
  return '\x01';
}

Assistant:

static nh_bool apply_override_list(struct curses_symdef *list, int len,
				   const struct curses_symdef *ovr, nh_bool cust)
{
    int i;
    for (i = 0; i < len; i++)
	if (!strcmp(list[i].symname, ovr->symname)) {
	    if (ovr->unichar[0])
		memcpy(list[i].unichar, ovr->unichar, sizeof(wchar_t) * CCHARW_MAX);
	    if (ovr->ch)
		list[i].ch = ovr->ch;
	    if (ovr->color != -1)
		list[i].color = ovr->color;
	    list[i].custom = cust;
	    return TRUE;
	}
    return FALSE;
}